

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall
Minisat::Solver::implies(Solver *this,vec<Minisat::Lit,_int> *assumps,vec<Minisat::Lit,_int> *out)

{
  Lit p;
  vec<Minisat::Lit,_int> *this_00;
  bool bVar1;
  CRef CVar2;
  int i;
  long lVar3;
  long lVar4;
  lbool local_42;
  lbool local_41;
  vec<Minisat::Lit,_int> *local_40;
  Size local_34;
  
  local_34 = (this->trail).sz;
  local_40 = out;
  vec<int,_int>::push(&this->trail_lim,&local_34);
  lVar3 = 0;
  do {
    if (assumps->sz <= lVar3) {
      lVar3 = (long)(this->trail).sz;
      CVar2 = propagate(this);
      this_00 = local_40;
      bVar1 = CVar2 == 0xffffffff;
      if (bVar1) {
        if (local_40->data != (Lit *)0x0) {
          local_40->sz = 0;
        }
        lVar4 = lVar3 * 4;
        for (; lVar3 < (this->trail).sz; lVar3 = lVar3 + 1) {
          vec<Minisat::Lit,_int>::push(this_00,(Lit *)((long)&((this->trail).data)->x + lVar4));
          lVar4 = lVar4 + 4;
        }
      }
LAB_0010d484:
      cancelUntil(this,0);
      return bVar1;
    }
    p.x = assumps->data[lVar3].x;
    local_41 = value(this,p);
    bVar1 = lbool::operator==(&local_41,l_False);
    if (bVar1) {
      bVar1 = false;
      goto LAB_0010d484;
    }
    local_42 = value(this,p);
    bVar1 = lbool::operator==(&local_42,l_Undef);
    if (bVar1) {
      uncheckedEnqueue(this,p,0xffffffff);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool Solver::implies(const vec<Lit>& assumps, vec<Lit>& out)
{
    trail_lim.push(trail.size());
    for (int i = 0; i < assumps.size(); i++){
        Lit a = assumps[i];

        if (value(a) == l_False){
            cancelUntil(0);
            return false;
        }else if (value(a) == l_Undef)
            uncheckedEnqueue(a);
    }

    unsigned trail_before = trail.size();
    bool     ret          = true;
    if (propagate() == CRef_Undef){
        out.clear();
        for (int j = trail_before; j < trail.size(); j++)
            out.push(trail[j]);
    }else
        ret = false;
    
    cancelUntil(0);
    return ret;
}